

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::
basic_json_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::next(basic_json_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
       *this)

{
  ser_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[8])(this,&ec);
  if (ec._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error
            (this_00,ec_00,(this->parser_).line_,
             ((this->parser_).position_ - (this->parser_).mark_position_) + 1);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void next() override
    {
        std::error_code ec;
        next(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
        }
    }